

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::anon_unknown_1::TextureVertexShader::shadeVertices
          (TextureVertexShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  float fVar1;
  VertexPacket *pVVar2;
  deInt32 dVar3;
  deInt32 dVar4;
  int iVar5;
  float *pfVar6;
  Vector<float,_4> local_70;
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  Vec4 texelValue;
  Vec4 position;
  VertexPacket *packet;
  int packetNdx;
  int numPackets_local;
  VertexPacket **packets_local;
  VertexAttrib *inputs_local;
  TextureVertexShader *this_local;
  
  for (packet._0_4_ = 0; (int)packet < numPackets; packet._0_4_ = (int)packet + 1) {
    pVVar2 = packets[(int)packet];
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(texelValue.m_data + 2));
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_50);
    rr::readVertexAttrib
              ((Vec4 *)(texelValue.m_data + 2),inputs,pVVar2->instanceNdx,pVVar2->vertexNdx);
    pfVar6 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(texelValue.m_data + 2));
    dVar3 = ::deRoundFloatToInt32(*pfVar6 * 4.0);
    pfVar6 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(texelValue.m_data + 2));
    dVar4 = ::deRoundFloatToInt32(*pfVar6 * 4.0);
    iVar5 = tcu::ConstPixelBufferAccess::getWidth(&this->m_texture);
    iVar5 = de::clamp<int>((dVar3 + 4) * (dVar4 + 4),0,iVar5 + -1);
    tcu::ConstPixelBufferAccess::getPixel
              ((ConstPixelBufferAccess *)local_60,(int)this + 0x38,iVar5,0);
    local_50 = (undefined1  [8])local_60._0_8_;
    texelValue.m_data[0] = (float)local_60._8_4_;
    texelValue.m_data[1] = (float)local_60._12_4_;
    rr::GenericVec4::operator=(pVVar2->outputs,(Vector<float,_4> *)local_50);
    pfVar6 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(texelValue.m_data + 2));
    fVar1 = *pfVar6;
    pfVar6 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(texelValue.m_data + 2));
    tcu::Vector<float,_4>::Vector(&local_70,(fVar1 - 0.5) * 2.0,(*pfVar6 - 0.5) * 2.0,0.0,1.0);
    *(undefined8 *)(pVVar2->position).m_data = local_70.m_data._0_8_;
    *(undefined8 *)((pVVar2->position).m_data + 2) = local_70.m_data._8_8_;
  }
  return;
}

Assistant:

void shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			rr::VertexPacket* const		packet		= packets[packetNdx];
			tcu::Vec4					position;
			tcu::Vec4					texelValue;

			readVertexAttrib(position, inputs[0], packet->instanceNdx, packet->vertexNdx);

			texelValue	= tcu::Vec4(m_texture.getPixel(de::clamp<int>((deRoundFloatToInt32(position.x() * 4) + 4) * (deRoundFloatToInt32(position.y() * 4) + 4), 0, m_texture.getWidth()-1), 0));

			packet->outputs[0]	= texelValue;
			packet->position	= tcu::Vec4(2.0f * (position.x() - 0.5f), 2.0f * (position.y() - 0.5f), 0.0f, 1.0f);
		}
	}